

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_context_uninit__jack(ma_context *pContext)

{
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x5275,"ma_result ma_context_uninit__jack(ma_context *)");
  }
  if (pContext->backend == ma_backend_jack) {
    ma__free_from_callbacks
              ((pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max,
               &pContext->allocationCallbacks);
    (pContext->field_21).alsa.snd_pcm_hw_params_get_channels_max = (ma_proc)0x0;
    dlclose((pContext->field_21).alsa.asoundSO);
    return 0;
  }
  __assert_fail("pContext->backend == ma_backend_jack",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                ,0x5276,"ma_result ma_context_uninit__jack(ma_context *)");
}

Assistant:

static ma_result ma_context_uninit__jack(ma_context* pContext)
{
    MA_ASSERT(pContext != NULL);
    MA_ASSERT(pContext->backend == ma_backend_jack);

    ma_free(pContext->jack.pClientName, &pContext->allocationCallbacks);
    pContext->jack.pClientName = NULL;

#ifndef MA_NO_RUNTIME_LINKING
    ma_dlclose(pContext, pContext->jack.jackSO);
#endif

    return MA_SUCCESS;
}